

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O2

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assign2product1<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *A,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  pointer pnVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  long lVar6;
  Real eps;
  bool bVar7;
  long lVar8;
  long lVar9;
  Item *pIVar10;
  ulong uVar11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  nzval;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  iVar2 = *(x->super_IdxSet).idx;
  pnVar4 = (x->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a8.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar4[iVar2].m_backend.data + 0x20);
  local_a8.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[iVar2].m_backend.data;
  local_a8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar4[iVar2].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar4[iVar2].m_backend.data + 0x10);
  local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  local_a8.exp = pnVar4[iVar2].m_backend.exp;
  local_a8.neg = pnVar4[iVar2].m_backend.neg;
  local_a8.fpclass = pnVar4[iVar2].m_backend.fpclass;
  local_a8.prec_elem = pnVar4[iVar2].m_backend.prec_elem;
  pIVar10 = (A->set).theitem + (A->set).thekey[iVar2].idx;
  local_68.m_backend.data._M_elems._0_8_ = local_a8.data._M_elems._0_8_;
  local_68.m_backend.data._M_elems._8_8_ = local_a8.data._M_elems._8_8_;
  local_68.m_backend.data._M_elems._16_8_ = local_a8.data._M_elems._16_8_;
  local_68.m_backend.data._M_elems._24_8_ = local_a8.data._M_elems._24_8_;
  local_68.m_backend.data._M_elems._32_8_ = local_a8.data._M_elems._32_8_;
  local_68.m_backend.exp = local_a8.exp;
  local_68.m_backend.neg = local_a8.neg;
  local_68.m_backend.fpclass = local_a8.fpclass;
  local_68.m_backend.prec_elem = local_a8.prec_elem;
  eps = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
  bVar7 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    (&local_68,eps);
  if (!bVar7) {
    uVar3 = (pIVar10->data).
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused;
    uVar11 = (ulong)uVar3;
    if (uVar11 != 0) {
      *(uint *)(this + 8) = uVar3;
      lVar9 = uVar11 * 0x3c;
      for (; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
        pNVar5 = (pIVar10->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        *(undefined4 *)(*(long *)(this + 0x10) + -4 + uVar11 * 4) =
             *(undefined4 *)((long)(&pNVar5[-1].val + 1) + lVar9);
        local_e8.fpclass = cpp_dec_float_finite;
        local_e8.prec_elem = 10;
        local_e8.data._M_elems[0] = 0;
        local_e8.data._M_elems[1] = 0;
        local_e8.data._M_elems[2] = 0;
        local_e8.data._M_elems[3] = 0;
        local_e8.data._M_elems[4] = 0;
        local_e8.data._M_elems[5] = 0;
        local_e8.data._M_elems._24_5_ = 0;
        local_e8.data._M_elems[7]._1_3_ = 0;
        local_e8.data._M_elems._32_5_ = 0;
        local_e8.data._M_elems[9]._1_3_ = 0;
        local_e8.exp = 0;
        local_e8.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_e8,&local_a8,
                   (cpp_dec_float<50U,_int,_void> *)((long)&pNVar5[-1].val.m_backend.data + lVar9));
        lVar6 = *(long *)(this + 0x20);
        lVar8 = (long)*(int *)((long)(&pNVar5[-1].val + 1) + lVar9) * 0x38;
        *(ulong *)(lVar6 + 0x20 + lVar8) =
             CONCAT35(local_e8.data._M_elems[9]._1_3_,local_e8.data._M_elems._32_5_);
        puVar1 = (uint *)(lVar6 + 0x10 + lVar8);
        *(undefined8 *)puVar1 = local_e8.data._M_elems._16_8_;
        *(ulong *)(puVar1 + 2) =
             CONCAT35(local_e8.data._M_elems[7]._1_3_,local_e8.data._M_elems._24_5_);
        *(undefined8 *)(lVar6 + lVar8) = local_e8.data._M_elems._0_8_;
        *(undefined8 *)((uint *)(lVar6 + lVar8) + 2) = local_e8.data._M_elems._8_8_;
        *(int *)(lVar6 + 0x28 + lVar8) = local_e8.exp;
        *(bool *)(lVar6 + 0x2c + lVar8) = local_e8.neg;
        *(undefined8 *)(lVar6 + 0x30 + lVar8) = local_e8._48_8_;
        lVar9 = lVar9 + -0x3c;
      }
      return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this;
    }
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2product1(const SVSetBase<S>& A, const SSVectorBase<T>& x)
{
   assert(x.isSetup());
   assert(x.size() == 1);

   // get the nonzero value of x and the corresponding vector in A:
   const int nzidx = x.idx[0];
   const T nzval = x.val[nzidx];
   const SVectorBase<S>& Ai = A[nzidx];

   // compute A[nzidx] * nzval:
   if(isZero(nzval, this->tolerances()->epsilon()) || Ai.size() == 0)
      clear();    // this := zero vector
   else
   {
      num = Ai.size();

      for(int j = num - 1; j >= 0; --j)
      {
         const Nonzero<S>& Aij = Ai.element(j);
         idx[j] = Aij.idx;
         VectorBase<R>::val[Aij.idx] = nzval * Aij.val;
      }
   }

   assert(isConsistent());

   return *this;
}